

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

int __thiscall clunk::HashEntry::Score(HashEntry *this,int ply)

{
  uint uVar1;
  
  if (99 < (uint)ply) {
    __assert_fail("(ply >= 0) & (ply < MaxPlies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0x46,"int clunk::HashEntry::Score(const int) const");
  }
  uVar1 = (uint)this->score;
  if ((int)uVar1 < 0x7919) {
    if ((int)uVar1 < -31000) {
      uVar1 = uVar1 + ply;
      if (-0x7919 < (int)uVar1) {
        __assert_fail("(score + ply) < -MateScore",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                      ,0x4d,"int clunk::HashEntry::Score(const int) const");
      }
      if (uVar1 < 0xffff8301) {
        __assert_fail("(score + ply) > -Infinity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                      ,0x4e,"int clunk::HashEntry::Score(const int) const");
      }
    }
  }
  else {
    uVar1 = uVar1 - ply;
    if ((int)uVar1 < 0x7919) {
      __assert_fail("(score - ply) > MateScore",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0x48,"int clunk::HashEntry::Score(const int) const");
    }
    if (31999 < uVar1) {
      __assert_fail("(score - ply) < Infinity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                    ,0x49,"int clunk::HashEntry::Score(const int) const");
    }
  }
  return uVar1;
}

Assistant:

int Score(const int ply) const {
    // get mate-in-N scores relative to root
    assert((ply >= 0) & (ply < MaxPlies));
    if (score > MateScore) {
      assert((score - ply) > MateScore);
      assert((score - ply) < Infinity);
      return (score - ply);
    }
    if (score < -MateScore) {
      assert((score + ply) < -MateScore);
      assert((score + ply) > -Infinity);
      return (score + ply);
    }
    assert(abs(score) < Infinity);
    return score;
  }